

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::flags_internal::FlagImpl::SetCallback
          (FlagImpl *this,FlagCallbackFunc mutation_callback)

{
  Mutex *mu;
  FlagCallback *this_00;
  MutexLock local_20;
  MutexLock l;
  FlagCallbackFunc mutation_callback_local;
  FlagImpl *this_local;
  
  l.mu_ = (Mutex *)mutation_callback;
  mu = DataGuard(this);
  MutexLock::MutexLock(&local_20,mu);
  if (this->callback_ == (FlagCallback *)0x0) {
    this_00 = (FlagCallback *)operator_new(0x10);
    FlagCallback::FlagCallback(this_00);
    this->callback_ = this_00;
  }
  this->callback_->func = (FlagCallbackFunc)l.mu_;
  InvokeCallback(this);
  MutexLock::~MutexLock(&local_20);
  return;
}

Assistant:

void FlagImpl::SetCallback(const FlagCallbackFunc mutation_callback) {
  absl::MutexLock l(DataGuard());

  if (callback_ == nullptr) {
    callback_ = new FlagCallback;
  }
  callback_->func = mutation_callback;

  InvokeCallback();
}